

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striped_unwind.c
# Opt level: O1

int * parasail_striped_unwind_32(int lena,int lenb,int segWidth,void *array_)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  piVar3 = (int *)malloc((long)lena * (long)lenb * 4);
  iVar2 = (lena + segWidth + -1) / segWidth;
  if (0 < lenb) {
    uVar6 = iVar2 * segWidth;
    uVar7 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar5 = 0;
        do {
          uVar1 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
          iVar4 = (int)((long)uVar1 % (long)segWidth) * iVar2 + (int)((long)uVar1 / (long)segWidth);
          if (iVar4 < lena) {
            piVar3[iVar4 * lenb + (int)uVar7] = *(int *)((long)array_ + uVar5 * 4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      uVar7 = uVar7 + 1;
      array_ = (void *)((long)array_ + (ulong)uVar6 * 4);
    } while (uVar7 != (uint)lenb);
  }
  return piVar3;
}

Assistant:

static inline int* CONCAT(parasail_striped_unwind_, T) (
        int lena,
        int lenb,
        int segWidth,
        void *array_)
{
    int i;
    int j;
    int *ret = (int*)malloc(sizeof(int)*lena*lenb);
    D *array = (D*)array_;
    const int32_t segLen = (lena + segWidth - 1) / segWidth;
    int32_t column_len = segLen * segWidth;
    for (j=0; j<lenb; ++j) {
        for (i=0; i<column_len; ++i) {
            int32_t i_unwound = i / segWidth + i % segWidth * segLen;
            if (i_unwound < lena) {
                ret[i_unwound*lenb + j] = (int)array[j*column_len + i];
            }
        }
    }
    return ret;
}